

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

char * lua_getupvalue(lua_State *L,int idx,int n)

{
  TValue *pTVar1;
  char *pcVar2;
  char *name;
  GCobj *o;
  TValue *val;
  int n_local;
  int idx_local;
  lua_State *L_local;
  TValue *local_30;
  lua_State *local_28;
  char *local_20;
  TValue *local_18;
  lua_State *local_10;
  
  val._0_4_ = n;
  val._4_4_ = idx;
  _n_local = L;
  pTVar1 = index2adr(L,idx);
  pcVar2 = lj_debug_uvnamev(pTVar1,(int)val - 1,(TValue **)&o,(GCobj **)&name);
  if (pcVar2 != (char *)0x0) {
    local_30 = _n_local->top;
    local_28 = _n_local;
    L_local = &o->th;
    *local_30 = (TValue)(o->gch).nextgc.gcptr64;
    local_10 = _n_local;
    local_20 = "copy of dead GC object";
    pTVar1 = _n_local->top;
    _n_local->top = pTVar1 + 1;
    if ((TValue *)(_n_local->maxstack).ptr64 <= pTVar1 + 1) {
      local_18 = local_30;
      lj_state_growstack1(_n_local);
    }
  }
  return pcVar2;
}

Assistant:

LUA_API const char *lua_getupvalue(lua_State *L, int idx, int n)
{
  TValue *val;
  GCobj *o;
  const char *name = lj_debug_uvnamev(index2adr(L, idx), (uint32_t)(n-1), &val, &o);
  if (name) {
    copyTV(L, L->top, val);
    incr_top(L);
  }
  return name;
}